

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadManager.h
# Opt level: O3

bool SL::Screen_Capture::
     TryCaptureMouse<SL::Screen_Capture::X11MouseProcessor,std::shared_ptr<SL::Screen_Capture::Thread_Data>>
               (shared_ptr<SL::Screen_Capture::Thread_Data> *data)

{
  element_type *peVar1;
  Timer *this;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> uVar2;
  DUPL_RETURN DVar3;
  DUPL_RETURN DVar4;
  int iVar5;
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> __s;
  long lVar6;
  int *piVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  char *pcVar8;
  bool bVar9;
  X11MouseProcessor frameprocessor;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  shared_ptr<SL::Screen_Capture::Thread_Data> local_98;
  timespec local_88;
  X11MouseProcessor local_78;
  
  X11MouseProcessor::X11MouseProcessor(&local_78);
  local_78.super_BaseMouseProcessor.super_BaseFrameProcessor.ImageBufferSize = 0x1000;
  __s.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (_Head_base<0UL,_unsigned_char_*,_false>)operator_new__(0x1000);
  memset((void *)__s.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,0x1000);
  uVar2._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       local_78.super_BaseMouseProcessor.super_BaseFrameProcessor.ImageBuffer;
  bVar9 = (_Head_base<0UL,_unsigned_char_*,_false>)
          local_78.super_BaseMouseProcessor.super_BaseFrameProcessor.ImageBuffer._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
          (_Head_base<0UL,_unsigned_char_*,_false>)0x0;
  local_78.super_BaseMouseProcessor.super_BaseFrameProcessor.ImageBuffer._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       __s.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (bVar9) {
    operator_delete__((void *)uVar2._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  local_98.super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (data->super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_98.super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (data->super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_98.super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_98.super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_98.super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  DVar3 = X11MouseProcessor::Init(&local_78,&local_98);
  if (local_98.super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.
               super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (DVar3 == DUPL_RETURN_SUCCESS) {
    do {
      if (((((data->super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>)
            ._M_ptr)->CommonData_).TerminateThreadsEvent._M_base._M_i & 1U) != 0) break;
      local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      peVar1 = (data->
               super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this = (peVar1->ScreenCaptureData).MouseTimer.
             super___shared_ptr<SL::Screen_Capture::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      __r = &(peVar1->ScreenCaptureData).MouseTimer.
             super___shared_ptr<SL::Screen_Capture::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_a0,__r);
      lVar6 = std::chrono::_V2::steady_clock::now();
      (this->Deadline).__d.__r = (this->Duration).__r * 1000 + lVar6;
      DVar4 = X11MouseProcessor::ProcessFrame(&local_78);
      if (DVar4 == DUPL_RETURN_SUCCESS) {
        Timer::wait(this,__r);
LAB_001121fd:
        if (((((data->
               super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->CommonData_).Paused._M_base._M_i & 1U) != 0) {
          local_88.tv_sec = 0;
          local_88.tv_nsec = 50000000;
          do {
            iVar5 = nanosleep(&local_88,&local_88);
            if (iVar5 != -1) break;
            piVar7 = __errno_location();
          } while (*piVar7 == 4);
          goto LAB_001121fd;
        }
      }
      else {
        bVar9 = DVar4 == DUPL_RETURN_ERROR_EXPECTED;
        pcVar8 = "Exiting Thread due to Unexpected error ";
        if (bVar9) {
          pcVar8 = "Exiting Thread due to expected error ";
        }
        LOCK();
        (&(((data->super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->CommonData_).UnexpectedErrorEvent)[bVar9]._M_base._M_i = true;
        UNLOCK();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,pcVar8,(ulong)!bVar9 * 2 + 0x25);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
      }
      if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
      }
    } while (DVar4 == DUPL_RETURN_SUCCESS);
  }
  X11MouseProcessor::~X11MouseProcessor(&local_78);
  return DVar3 == DUPL_RETURN_SUCCESS;
}

Assistant:

bool TryCaptureMouse(const F &data, E... args)
    {
        T frameprocessor;
        frameprocessor.ImageBufferSize = 32 * 32 * sizeof(ImageBGRA);
        frameprocessor.ImageBuffer = std::make_unique<unsigned char[]>(frameprocessor.ImageBufferSize);
        auto ret = frameprocessor.Init(data);
        if (ret != DUPL_RETURN_SUCCESS) {
            return false;
        } 
        while (!data->CommonData_.TerminateThreadsEvent) {
            // get a copy of the shared_ptr in a safe way

            std::shared_ptr<Timer> timer;
            if constexpr(sizeof...(args) == 1) {
                timer = data->WindowCaptureData.MouseTimer;
            }
            else {
                timer = data->ScreenCaptureData.MouseTimer;
            }

            timer->start();
            // Process Frame
            ret = frameprocessor.ProcessFrame();
            if (ret != DUPL_RETURN_SUCCESS) {
                if (ret == DUPL_RETURN_ERROR_EXPECTED) {
                    // The system is in a transition state so request the duplication be restarted
                    data->CommonData_.ExpectedErrorEvent = true;
                    std::cout << "Exiting Thread due to expected error " << std::endl;
                }
                else {
                    // Unexpected error so exit the application
                    data->CommonData_.UnexpectedErrorEvent = true;
                    std::cout << "Exiting Thread due to Unexpected error " << std::endl;
                }
                return true;
            }
            timer->wait();
            while (data->CommonData_.Paused) {
                std::this_thread::sleep_for(50ms);
            }
        }
        return true;
    }